

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::_swap_hierarchy(Tree *this,size_t ia,size_t ib)

{
  NodeData *pNVar1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  size_t sVar14;
  bool bVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  size_t sVar19;
  size_t sVar20;
  NodeData *pNVar21;
  unsigned_long __tmp;
  NodeData *pNVar22;
  ulong extraout_RDX;
  char *this_00;
  char msg [39];
  Tree local_1f8;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  if (ia == ib) {
    return;
  }
  for (uVar16 = first_child(this,ia); uVar16 != 0xffffffffffffffff;
      uVar16 = next_sibling(this,uVar16)) {
    if (uVar16 != ia && uVar16 != ib) {
      if (this->m_cap <= uVar16) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_1f8.m_buf = (NodeData *)0x0;
        local_1f8.m_cap = 0x4b83;
        local_1f8.m_size = 0;
        local_1f8.m_free_head._0_4_ = 0x24bb3d;
        local_1f8.m_free_head._4_4_ = 0;
        local_1f8.m_free_tail._0_7_ = 0x65;
        local_1f8.m_free_tail._7_1_ = 0;
        (*(code *)PTR_error_impl_0029d7a8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      this->m_buf[uVar16].m_parent = ib;
    }
  }
  uVar16 = ib;
  this_00 = (char *)this;
  sVar17 = first_child(this,ib);
  while (uVar18 = sVar17, uVar18 != 0xffffffffffffffff) {
    if (uVar18 != ia && uVar18 != ib) {
      if (this->m_cap <= uVar18) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_1f8.m_buf = (NodeData *)0x0;
        local_1f8.m_cap = 0x4b83;
        local_1f8.m_size = 0;
        local_1f8.m_free_head._0_4_ = 0x24bb3d;
        local_1f8.m_free_head._4_4_ = 0;
        local_1f8.m_free_tail._0_7_ = 0x65;
        local_1f8.m_free_tail._7_1_ = 0;
        (*(code *)PTR_error_impl_0029d7a8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      this->m_buf[uVar18].m_parent = ia;
    }
    this_00 = (char *)this;
    sVar17 = next_sibling(this,uVar18);
    uVar16 = uVar18;
  }
  uVar18 = this->m_cap;
  if (ia == 0xffffffffffffffff || uVar18 <= ia) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_1f8.m_buf = (NodeData *)0x0;
    local_1f8.m_cap = 0x4b83;
    local_1f8.m_size = 0;
    local_1f8.m_free_head._0_4_ = 0x24bb3d;
    local_1f8.m_free_head._4_4_ = 0;
    local_1f8.m_free_tail._0_7_ = 0x65;
    local_1f8.m_free_tail._7_1_ = 0;
    this_00 = "check failed: i != NONE && i >= 0 && i < m_cap";
    uVar16 = 0;
    (*(code *)PTR_error_impl_0029d7a8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    uVar18 = this->m_cap;
  }
  pNVar1 = this->m_buf;
  sVar17 = CONCAT71((int7)(uVar16 >> 8),ib < uVar18);
  pNVar21 = pNVar1;
  if (ib == 0xffffffffffffffff || ib >= uVar18) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_1f8.m_buf = (NodeData *)0x0;
    local_1f8.m_cap = 0x4b83;
    local_1f8.m_size = 0;
    local_1f8.m_free_head._0_4_ = 0x24bb3d;
    local_1f8.m_free_head._4_4_ = 0;
    local_1f8.m_free_tail._0_7_ = 0x65;
    local_1f8.m_free_tail._7_1_ = 0;
    this_00 = "check failed: i != NONE && i >= 0 && i < m_cap";
    sVar17 = 0x2e;
    (*(code *)PTR_error_impl_0029d7a8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pNVar21 = this->m_buf;
    uVar18 = this->m_cap;
  }
  local_1f8.m_arena.len = (size_t)(pNVar21 + ib);
  uVar16 = pNVar1[ia].m_parent;
  if ((uVar16 == 0xffffffffffffffff) || (uVar18 <= uVar16)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_1f8.m_buf = (NodeData *)0x0;
    local_1f8.m_cap = 0x4b83;
    local_1f8.m_size = 0;
    local_1f8.m_free_head._0_4_ = 0x24bb3d;
    local_1f8.m_free_head._4_4_ = 0;
    local_1f8.m_free_tail._0_7_ = 0x65;
    local_1f8.m_free_tail._7_1_ = 0;
    this_00 = "check failed: i != NONE && i >= 0 && i < m_cap";
    sVar17 = 0x2e;
    (*(code *)PTR_error_impl_0029d7a8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pNVar21 = this->m_buf;
    uVar18 = this->m_cap;
  }
  pNVar22 = pNVar21 + uVar16;
  uVar16 = *(size_t *)(local_1f8.m_arena.len + 0x68);
  if ((uVar16 == 0xffffffffffffffff) || (uVar18 <= uVar16)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_1f8.m_buf = (NodeData *)0x0;
    local_1f8.m_cap = 0x4b83;
    local_1f8.m_size = 0;
    local_1f8.m_free_head._0_4_ = 0x24bb3d;
    local_1f8.m_free_head._4_4_ = 0;
    local_1f8.m_free_tail._0_7_ = 0x65;
    local_1f8.m_free_tail._7_1_ = 0;
    this_00 = "check failed: i != NONE && i >= 0 && i < m_cap";
    sVar17 = 0x2e;
    (*(code *)PTR_error_impl_0029d7a8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pNVar21 = this->m_buf;
  }
  sVar14 = local_1f8.m_arena.len;
  pNVar21 = pNVar21 + uVar16;
  sVar19 = pNVar22->m_first_child;
  if (pNVar22 == pNVar21) {
    if ((sVar19 == ib) && (sVar17 = ia, pNVar22->m_last_child == ia)) {
LAB_002090b5:
      pNVar22->m_first_child = sVar17;
      pNVar22->m_last_child = sVar19;
    }
    else {
      if (sVar19 == ia) {
        sVar17 = ib;
        if (pNVar22->m_last_child == ib) goto LAB_002090b5;
        pNVar22->m_first_child = ib;
        bVar15 = true;
      }
      else {
        bVar15 = false;
      }
      if (pNVar22->m_last_child == ia) {
        pNVar22->m_last_child = ib;
        bVar15 = true;
      }
      if ((pNVar21->m_first_child == ib) && (!bVar15)) {
        pNVar21->m_first_child = ia;
      }
      if ((pNVar21->m_last_child == ib) && (!bVar15)) goto LAB_00209086;
    }
  }
  else {
    if (sVar19 == ia) {
      pNVar22->m_first_child = ib;
    }
    if (pNVar22->m_last_child == ia) {
      pNVar22->m_last_child = ib;
    }
    if (pNVar21->m_first_child == ib) {
      pNVar21->m_first_child = ia;
    }
    if (pNVar21->m_last_child == ib) {
LAB_00209086:
      pNVar21->m_last_child = ia;
    }
  }
  sVar19 = pNVar1[ia].m_first_child;
  pNVar1[ia].m_first_child = *(size_t *)(local_1f8.m_arena.len + 0x70);
  *(size_t *)(local_1f8.m_arena.len + 0x70) = sVar19;
  sVar19 = pNVar1[ia].m_last_child;
  pNVar1[ia].m_last_child = *(size_t *)(local_1f8.m_arena.len + 0x78);
  *(size_t *)(local_1f8.m_arena.len + 0x78) = sVar19;
  sVar19 = pNVar1[ia].m_prev_sibling;
  if (sVar19 == ib) {
    if (pNVar1[ia].m_next_sibling == ib) {
      sVar20 = *(size_t *)(local_1f8.m_arena.len + 0x88);
LAB_00209501:
      if (sVar20 != ia) {
        local_1f8.m_size._0_1_ = '.';
        local_1f8.m_size._1_1_ = 'm';
        local_1f8.m_size._2_1_ = '_';
        local_1f8.m_size._3_1_ = 'p';
        local_1f8.m_size._4_1_ = 'r';
        local_1f8.m_size._5_1_ = 'e';
        local_1f8.m_size._6_1_ = 'v';
        local_1f8.m_size._7_1_ = '_';
        local_1f8.m_free_head._0_4_ = 0x6c626973;
        local_1f8.m_buf = (NodeData *)0x6166206b63656863;
        local_1f8.m_cap._0_1_ = 'i';
        local_1f8.m_cap._1_1_ = 'l';
        local_1f8.m_cap._2_1_ = 'e';
        local_1f8.m_cap._3_1_ = 'd';
        local_1f8.m_cap._4_1_ = ':';
        local_1f8.m_cap._5_1_ = ' ';
        local_1f8.m_cap._6_1_ = '(';
        local_1f8.m_cap._7_1_ = 'b';
        local_1f8.m_free_head._4_4_ = 0x20676e69;
        local_1f8.m_free_tail._0_7_ = 0x296169203d3d;
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_58 = 0;
        uStack_50 = 0x64bd;
        local_48 = 0;
        pcStack_40 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_38 = 0x65;
        this_00 = (char *)&local_1f8;
        sVar17 = 0x27;
        auVar4 = ZEXT1224(ZEXT412(0x64bd) << 0x40);
        LVar7.name.str._0_4_ = 0x24bb3d;
        LVar7.super_LineCol.offset = auVar4._0_8_;
        LVar7.super_LineCol.line = auVar4._8_8_;
        LVar7.super_LineCol.col = auVar4._16_8_;
        LVar7.name.str._4_4_ = 0;
        LVar7.name.len = 0x65;
        (*(this->m_callbacks).m_error)(this_00,0x27,LVar7,(this->m_callbacks).m_user_data);
        sVar19 = pNVar1[ia].m_prev_sibling;
      }
      if (sVar19 != 0xffffffffffffffff) {
        if (sVar19 == ib) {
          local_1f8.m_size._0_1_ = '.';
          local_1f8.m_size._1_1_ = 'm';
          local_1f8.m_size._2_1_ = '_';
          local_1f8.m_size._3_1_ = 'p';
          local_1f8.m_size._4_1_ = 'r';
          local_1f8.m_size._5_1_ = 'e';
          local_1f8.m_size._6_1_ = 'v';
          local_1f8.m_size._7_1_ = '_';
          local_1f8.m_free_head._0_4_ = 0x6c626973;
          local_1f8.m_buf = (NodeData *)0x6166206b63656863;
          local_1f8.m_cap._0_1_ = 'i';
          local_1f8.m_cap._1_1_ = 'l';
          local_1f8.m_cap._2_1_ = 'e';
          local_1f8.m_cap._3_1_ = 'd';
          local_1f8.m_cap._4_1_ = ':';
          local_1f8.m_cap._5_1_ = ' ';
          local_1f8.m_cap._6_1_ = '(';
          local_1f8.m_cap._7_1_ = 'a';
          local_1f8.m_free_head._4_4_ = 0x20676e69;
          local_1f8.m_free_tail._0_7_ = 0x296269203d21;
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_80 = 0;
          uStack_78 = 0x64c0;
          local_70 = 0;
          pcStack_68 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_60 = 0x65;
          this_00 = (char *)&local_1f8;
          sVar17 = 0x27;
          auVar4 = ZEXT1224(ZEXT412(0x64c0) << 0x40);
          LVar8.name.str._0_4_ = 0x24bb3d;
          LVar8.super_LineCol.offset = auVar4._0_8_;
          LVar8.super_LineCol.line = auVar4._8_8_;
          LVar8.super_LineCol.col = auVar4._16_8_;
          LVar8.name.str._4_4_ = 0;
          LVar8.name.len = 0x65;
          (*(this->m_callbacks).m_error)(this_00,0x27,LVar8,(this->m_callbacks).m_user_data);
          sVar19 = pNVar1[ia].m_prev_sibling;
        }
        if ((sVar19 == 0xffffffffffffffff) || (this->m_cap <= sVar19)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_1f8.m_buf = (NodeData *)0x0;
          local_1f8.m_cap = 0x4b83;
          local_1f8.m_size = 0;
          local_1f8.m_free_head._0_4_ = 0x24bb3d;
          local_1f8.m_free_head._4_4_ = 0;
          local_1f8.m_free_tail._0_7_ = 0x65;
          local_1f8.m_free_tail._7_1_ = 0;
          this_00 = "check failed: i != NONE && i >= 0 && i < m_cap";
          sVar17 = 0x2e;
          (*(code *)PTR_error_impl_0029d7a8)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        this->m_buf[sVar19].m_next_sibling = ib;
      }
      sVar19 = *(size_t *)(sVar14 + 0x80);
      if (sVar19 == 0xffffffffffffffff) {
        sVar20 = 0xffffffffffffffff;
      }
      else {
        if (sVar19 == ia) {
          local_1f8.m_size._0_1_ = '.';
          local_1f8.m_size._1_1_ = 'm';
          local_1f8.m_size._2_1_ = '_';
          local_1f8.m_size._3_1_ = 'n';
          local_1f8.m_size._4_1_ = 'e';
          local_1f8.m_size._5_1_ = 'x';
          local_1f8.m_size._6_1_ = 't';
          local_1f8.m_size._7_1_ = '_';
          local_1f8.m_free_head._0_4_ = 0x6c626973;
          local_1f8.m_buf = (NodeData *)0x6166206b63656863;
          local_1f8.m_cap._0_1_ = 'i';
          local_1f8.m_cap._1_1_ = 'l';
          local_1f8.m_cap._2_1_ = 'e';
          local_1f8.m_cap._3_1_ = 'd';
          local_1f8.m_cap._4_1_ = ':';
          local_1f8.m_cap._5_1_ = ' ';
          local_1f8.m_cap._6_1_ = '(';
          local_1f8.m_cap._7_1_ = 'b';
          local_1f8.m_free_head._4_4_ = 0x20676e69;
          local_1f8.m_free_tail._0_7_ = 0x296169203d21;
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_a8 = 0;
          uStack_a0 = 0x64c5;
          local_98 = 0;
          pcStack_90 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_88 = 0x65;
          this_00 = (char *)&local_1f8;
          sVar17 = 0x27;
          auVar4 = ZEXT1224(ZEXT412(0x64c5) << 0x40);
          LVar9.name.str._0_4_ = 0x24bb3d;
          LVar9.super_LineCol.offset = auVar4._0_8_;
          LVar9.super_LineCol.line = auVar4._8_8_;
          LVar9.super_LineCol.col = auVar4._16_8_;
          LVar9.name.str._4_4_ = 0;
          LVar9.name.len = 0x65;
          (*(this->m_callbacks).m_error)(this_00,0x27,LVar9,(this->m_callbacks).m_user_data);
          sVar19 = *(size_t *)(sVar14 + 0x80);
        }
        if ((sVar19 == 0xffffffffffffffff) || (sVar20 = sVar19, this->m_cap <= sVar19)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_1f8.m_buf = (NodeData *)0x0;
          local_1f8.m_cap = 0x4b83;
          local_1f8.m_size = 0;
          local_1f8.m_free_head._0_4_ = 0x24bb3d;
          local_1f8.m_free_head._4_4_ = 0;
          local_1f8.m_free_tail._0_7_ = 0x65;
          local_1f8.m_free_tail._7_1_ = 0;
          this_00 = "check failed: i != NONE && i >= 0 && i < m_cap";
          sVar17 = 0x2e;
          (*(code *)PTR_error_impl_0029d7a8)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
          sVar20 = *(size_t *)(sVar14 + 0x80);
        }
        this->m_buf[sVar19].m_prev_sibling = ia;
      }
      *(size_t *)(sVar14 + 0x88) = pNVar1[ia].m_prev_sibling;
      *(size_t *)(sVar14 + 0x80) = ia;
      pNVar1[ia].m_prev_sibling = ib;
      pNVar1[ia].m_next_sibling = sVar20;
      goto LAB_002098ad;
    }
LAB_00209156:
    if (*(size_t *)(sVar14 + 0x80) != ia) {
      local_1f8.m_size._0_1_ = '.';
      local_1f8.m_size._1_1_ = 'm';
      local_1f8.m_size._2_1_ = '_';
      local_1f8.m_size._3_1_ = 'n';
      local_1f8.m_size._4_1_ = 'e';
      local_1f8.m_size._5_1_ = 'x';
      local_1f8.m_size._6_1_ = 't';
      local_1f8.m_size._7_1_ = '_';
      local_1f8.m_free_head._0_4_ = 0x6c626973;
      local_1f8.m_buf = (NodeData *)0x6166206b63656863;
      local_1f8.m_cap._0_1_ = 'i';
      local_1f8.m_cap._1_1_ = 'l';
      local_1f8.m_cap._2_1_ = 'e';
      local_1f8.m_cap._3_1_ = 'd';
      local_1f8.m_cap._4_1_ = ':';
      local_1f8.m_cap._5_1_ = ' ';
      local_1f8.m_cap._6_1_ = '(';
      local_1f8.m_cap._7_1_ = 'b';
      local_1f8.m_free_head._4_4_ = 0x20676e69;
      local_1f8.m_free_tail._0_7_ = 0x296169203d3d;
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_d0 = 0;
      uStack_c8 = 0x64d0;
      local_c0 = 0;
      pcStack_b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_b0 = 0x65;
      this_00 = (char *)&local_1f8;
      sVar17 = 0x27;
      auVar4 = ZEXT1224(ZEXT412(0x64d0) << 0x40);
      LVar3.name.str._0_4_ = 0x24bb3d;
      LVar3.super_LineCol.offset = auVar4._0_8_;
      LVar3.super_LineCol.line = auVar4._8_8_;
      LVar3.super_LineCol.col = auVar4._16_8_;
      LVar3.name.str._4_4_ = 0;
      LVar3.name.len = 0x65;
      (*(this->m_callbacks).m_error)(this_00,0x27,LVar3,(this->m_callbacks).m_user_data);
    }
    sVar19 = *(size_t *)(sVar14 + 0x88);
    if (sVar19 != 0xffffffffffffffff) {
      if (sVar19 == ia) {
        local_1f8.m_size._0_1_ = '.';
        local_1f8.m_size._1_1_ = 'm';
        local_1f8.m_size._2_1_ = '_';
        local_1f8.m_size._3_1_ = 'p';
        local_1f8.m_size._4_1_ = 'r';
        local_1f8.m_size._5_1_ = 'e';
        local_1f8.m_size._6_1_ = 'v';
        local_1f8.m_size._7_1_ = '_';
        local_1f8.m_free_head._0_4_ = 0x6c626973;
        local_1f8.m_buf = (NodeData *)0x6166206b63656863;
        local_1f8.m_cap._0_1_ = 'i';
        local_1f8.m_cap._1_1_ = 'l';
        local_1f8.m_cap._2_1_ = 'e';
        local_1f8.m_cap._3_1_ = 'd';
        local_1f8.m_cap._4_1_ = ':';
        local_1f8.m_cap._5_1_ = ' ';
        local_1f8.m_cap._6_1_ = '(';
        local_1f8.m_cap._7_1_ = 'b';
        local_1f8.m_free_head._4_4_ = 0x20676e69;
        local_1f8.m_free_tail._0_7_ = 0x296169203d21;
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_f8 = 0;
        uStack_f0 = 0x64d3;
        local_e8 = 0;
        pcStack_e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_d8 = 0x65;
        this_00 = (char *)&local_1f8;
        sVar17 = 0x27;
        auVar4 = ZEXT1224(ZEXT412(0x64d3) << 0x40);
        LVar5.name.str._0_4_ = 0x24bb3d;
        LVar5.super_LineCol.offset = auVar4._0_8_;
        LVar5.super_LineCol.line = auVar4._8_8_;
        LVar5.super_LineCol.col = auVar4._16_8_;
        LVar5.name.str._4_4_ = 0;
        LVar5.name.len = 0x65;
        (*(this->m_callbacks).m_error)(this_00,0x27,LVar5,(this->m_callbacks).m_user_data);
        sVar19 = *(size_t *)(sVar14 + 0x88);
      }
      if ((sVar19 == 0xffffffffffffffff) || (this->m_cap <= sVar19)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_1f8.m_buf = (NodeData *)0x0;
        local_1f8.m_cap = 0x4b83;
        local_1f8.m_size = 0;
        local_1f8.m_free_head._0_4_ = 0x24bb3d;
        local_1f8.m_free_head._4_4_ = 0;
        local_1f8.m_free_tail._0_7_ = 0x65;
        local_1f8.m_free_tail._7_1_ = 0;
        this_00 = "check failed: i != NONE && i >= 0 && i < m_cap";
        sVar17 = 0x2e;
        (*(code *)PTR_error_impl_0029d7a8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      this->m_buf[sVar19].m_next_sibling = ia;
    }
    sVar19 = pNVar1[ia].m_next_sibling;
    if (sVar19 != 0xffffffffffffffff) {
      if (sVar19 == ib) {
        local_1f8.m_size._0_1_ = '.';
        local_1f8.m_size._1_1_ = 'm';
        local_1f8.m_size._2_1_ = '_';
        local_1f8.m_size._3_1_ = 'n';
        local_1f8.m_size._4_1_ = 'e';
        local_1f8.m_size._5_1_ = 'x';
        local_1f8.m_size._6_1_ = 't';
        local_1f8.m_size._7_1_ = '_';
        local_1f8.m_free_head._0_4_ = 0x6c626973;
        local_1f8.m_buf = (NodeData *)0x6166206b63656863;
        local_1f8.m_cap._0_1_ = 'i';
        local_1f8.m_cap._1_1_ = 'l';
        local_1f8.m_cap._2_1_ = 'e';
        local_1f8.m_cap._3_1_ = 'd';
        local_1f8.m_cap._4_1_ = ':';
        local_1f8.m_cap._5_1_ = ' ';
        local_1f8.m_cap._6_1_ = '(';
        local_1f8.m_cap._7_1_ = 'a';
        local_1f8.m_free_head._4_4_ = 0x20676e69;
        local_1f8.m_free_tail._0_7_ = 0x296269203d21;
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_1f8.m_tag_directives[3].handle.str = (char *)0x0;
        local_1f8.m_tag_directives[3].handle.len = 0x64d8;
        local_1f8.m_tag_directives[3].prefix.str = (char *)0x0;
        local_1f8.m_tag_directives[3].prefix.len = 0x24bb3d;
        local_1f8.m_tag_directives[3].next_node_id = 0x65;
        this_00 = (char *)&local_1f8;
        sVar17 = 0x27;
        auVar4 = ZEXT1224(ZEXT412(0x64d8) << 0x40);
        LVar6.name.str._0_4_ = 0x24bb3d;
        LVar6.super_LineCol.offset = auVar4._0_8_;
        LVar6.super_LineCol.line = auVar4._8_8_;
        LVar6.super_LineCol.col = auVar4._16_8_;
        LVar6.name.str._4_4_ = 0;
        LVar6.name.len = 0x65;
        (*(this->m_callbacks).m_error)(this_00,0x27,LVar6,(this->m_callbacks).m_user_data);
        sVar19 = pNVar1[ia].m_next_sibling;
      }
      if ((sVar19 == 0xffffffffffffffff) || (this->m_cap <= sVar19)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_1f8.m_buf = (NodeData *)0x0;
        local_1f8.m_cap = 0x4b83;
        local_1f8.m_size = 0;
        local_1f8.m_free_head._0_4_ = 0x24bb3d;
        local_1f8.m_free_head._4_4_ = 0;
        local_1f8.m_free_tail._0_7_ = 0x65;
        local_1f8.m_free_tail._7_1_ = 0;
        this_00 = "check failed: i != NONE && i >= 0 && i < m_cap";
        sVar17 = 0x2e;
        (*(code *)PTR_error_impl_0029d7a8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      this->m_buf[sVar19].m_prev_sibling = ib;
    }
    sVar19 = *(size_t *)(sVar14 + 0x88);
    pNVar1[ia].m_prev_sibling = sVar19;
    pNVar1[ia].m_next_sibling = ib;
    *(size_t *)(sVar14 + 0x88) = ia;
  }
  else {
    sVar20 = *(size_t *)(local_1f8.m_arena.len + 0x88);
    sVar17 = pNVar1[ia].m_next_sibling;
    if (sVar20 == ia) {
LAB_00209148:
      if (sVar17 == ib) goto LAB_00209501;
      _swap_hierarchy();
      goto LAB_00209156;
    }
    if (sVar17 == ib) goto LAB_00209501;
    if (*(size_t *)(local_1f8.m_arena.len + 0x80) == ia) goto LAB_00209148;
    if (sVar19 != 0xffffffffffffffff) {
      this_00 = (char *)this;
      pNVar21 = _p(this,sVar19);
      pNVar21->m_next_sibling = ib;
      sVar17 = pNVar1[ia].m_next_sibling;
    }
    if (sVar17 != ib && sVar17 != 0xffffffffffffffff) {
      this_00 = (char *)this;
      pNVar21 = _p(this,sVar17);
      pNVar21->m_prev_sibling = ib;
    }
    sVar17 = *(size_t *)(sVar14 + 0x88);
    if (sVar17 != ia && sVar17 != 0xffffffffffffffff) {
      this_00 = (char *)this;
      pNVar21 = _p(this,sVar17);
      pNVar21->m_next_sibling = ia;
    }
    sVar17 = *(size_t *)(sVar14 + 0x80);
    if (sVar17 != ia && sVar17 != 0xffffffffffffffff) {
      this_00 = (char *)this;
      pNVar21 = _p(this,sVar17);
      pNVar21->m_prev_sibling = ia;
    }
    sVar19 = pNVar1[ia].m_prev_sibling;
    pNVar1[ia].m_prev_sibling = *(size_t *)(sVar14 + 0x88);
    *(size_t *)(sVar14 + 0x88) = sVar19;
    sVar19 = pNVar1[ia].m_next_sibling;
    pNVar1[ia].m_next_sibling = *(size_t *)(sVar14 + 0x80);
  }
  *(size_t *)(sVar14 + 0x80) = sVar19;
LAB_002098ad:
  if (pNVar1[ia].m_next_sibling == ia) {
    local_1f8.m_size._0_1_ = '.';
    local_1f8.m_size._1_1_ = 'm';
    local_1f8.m_size._2_1_ = '_';
    local_1f8.m_size._3_1_ = 'n';
    local_1f8.m_size._4_1_ = 'e';
    local_1f8.m_size._5_1_ = 'x';
    local_1f8.m_size._6_1_ = 't';
    local_1f8.m_size._7_1_ = '_';
    local_1f8.m_free_head._0_4_ = 0x6c626973;
    local_1f8.m_buf = (NodeData *)0x6166206b63656863;
    local_1f8.m_cap._0_1_ = 'i';
    local_1f8.m_cap._1_1_ = 'l';
    local_1f8.m_cap._2_1_ = 'e';
    local_1f8.m_cap._3_1_ = 'd';
    local_1f8.m_cap._4_1_ = ':';
    local_1f8.m_cap._5_1_ = ' ';
    local_1f8.m_cap._6_1_ = '(';
    local_1f8.m_cap._7_1_ = 'a';
    local_1f8.m_free_head._4_4_ = 0x20676e69;
    local_1f8.m_free_tail._0_7_ = 0x296169203d21;
    if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_1f8.m_tag_directives[2].handle.str = (char *)0x0;
    local_1f8.m_tag_directives[2].handle.len = 0x64e6;
    local_1f8.m_tag_directives[2].prefix.str = (char *)0x0;
    local_1f8.m_tag_directives[2].prefix.len = 0x24bb3d;
    local_1f8.m_tag_directives[2].next_node_id = 0x65;
    this_00 = (char *)&local_1f8;
    sVar17 = 0x27;
    auVar4 = ZEXT1224(ZEXT412(0x64e6) << 0x40);
    LVar10.name.str._0_4_ = 0x24bb3d;
    LVar10.super_LineCol.offset = auVar4._0_8_;
    LVar10.super_LineCol.line = auVar4._8_8_;
    LVar10.super_LineCol.col = auVar4._16_8_;
    LVar10.name.str._4_4_ = 0;
    LVar10.name.len = 0x65;
    (*(this->m_callbacks).m_error)(this_00,0x27,LVar10,(this->m_callbacks).m_user_data);
  }
  if (pNVar1[ia].m_prev_sibling == ia) {
    local_1f8.m_size._0_1_ = '.';
    local_1f8.m_size._1_1_ = 'm';
    local_1f8.m_size._2_1_ = '_';
    local_1f8.m_size._3_1_ = 'p';
    local_1f8.m_size._4_1_ = 'r';
    local_1f8.m_size._5_1_ = 'e';
    local_1f8.m_size._6_1_ = 'v';
    local_1f8.m_size._7_1_ = '_';
    local_1f8.m_free_head._0_4_ = 0x6c626973;
    local_1f8.m_buf = (NodeData *)0x6166206b63656863;
    local_1f8.m_cap._0_1_ = 'i';
    local_1f8.m_cap._1_1_ = 'l';
    local_1f8.m_cap._2_1_ = 'e';
    local_1f8.m_cap._3_1_ = 'd';
    local_1f8.m_cap._4_1_ = ':';
    local_1f8.m_cap._5_1_ = ' ';
    local_1f8.m_cap._6_1_ = '(';
    local_1f8.m_cap._7_1_ = 'a';
    local_1f8.m_free_head._4_4_ = 0x20676e69;
    local_1f8.m_free_tail._0_7_ = 0x296169203d21;
    if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_1f8.m_tag_directives[1].handle.str = (char *)0x0;
    local_1f8.m_tag_directives[1].handle.len = 0x64e7;
    local_1f8.m_tag_directives[1].prefix.str = (char *)0x0;
    local_1f8.m_tag_directives[1].prefix.len = 0x24bb3d;
    local_1f8.m_tag_directives[1].next_node_id = 0x65;
    this_00 = (char *)&local_1f8;
    sVar17 = 0x27;
    auVar4 = ZEXT1224(ZEXT412(0x64e7) << 0x40);
    LVar11.name.str._0_4_ = 0x24bb3d;
    LVar11.super_LineCol.offset = auVar4._0_8_;
    LVar11.super_LineCol.line = auVar4._8_8_;
    LVar11.super_LineCol.col = auVar4._16_8_;
    LVar11.name.str._4_4_ = 0;
    LVar11.name.len = 0x65;
    (*(this->m_callbacks).m_error)(this_00,0x27,LVar11,(this->m_callbacks).m_user_data);
  }
  if (*(size_t *)(sVar14 + 0x80) == ib) {
    local_1f8.m_size._0_1_ = '.';
    local_1f8.m_size._1_1_ = 'm';
    local_1f8.m_size._2_1_ = '_';
    local_1f8.m_size._3_1_ = 'n';
    local_1f8.m_size._4_1_ = 'e';
    local_1f8.m_size._5_1_ = 'x';
    local_1f8.m_size._6_1_ = 't';
    local_1f8.m_size._7_1_ = '_';
    local_1f8.m_free_head._0_4_ = 0x6c626973;
    local_1f8.m_buf = (NodeData *)0x6166206b63656863;
    local_1f8.m_cap._0_1_ = 'i';
    local_1f8.m_cap._1_1_ = 'l';
    local_1f8.m_cap._2_1_ = 'e';
    local_1f8.m_cap._3_1_ = 'd';
    local_1f8.m_cap._4_1_ = ':';
    local_1f8.m_cap._5_1_ = ' ';
    local_1f8.m_cap._6_1_ = '(';
    local_1f8.m_cap._7_1_ = 'b';
    local_1f8.m_free_head._4_4_ = 0x20676e69;
    local_1f8.m_free_tail._0_7_ = 0x296269203d21;
    if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_1f8.m_tag_directives[0].handle.str = (char *)0x0;
    local_1f8.m_tag_directives[0].handle.len = 0x64e8;
    local_1f8.m_tag_directives[0].prefix.str = (char *)0x0;
    local_1f8.m_tag_directives[0].prefix.len = 0x24bb3d;
    local_1f8.m_tag_directives[0].next_node_id = 0x65;
    this_00 = (char *)&local_1f8;
    sVar17 = 0x27;
    auVar4 = ZEXT1224(ZEXT412(0x64e8) << 0x40);
    LVar12.name.str._0_4_ = 0x24bb3d;
    LVar12.super_LineCol.offset = auVar4._0_8_;
    LVar12.super_LineCol.line = auVar4._8_8_;
    LVar12.super_LineCol.col = auVar4._16_8_;
    LVar12.name.str._4_4_ = 0;
    LVar12.name.len = 0x65;
    (*(this->m_callbacks).m_error)(this_00,0x27,LVar12,(this->m_callbacks).m_user_data);
  }
  if (*(size_t *)(sVar14 + 0x88) == ib) {
    local_1f8.m_size._0_1_ = '.';
    local_1f8.m_size._1_1_ = 'm';
    local_1f8.m_size._2_1_ = '_';
    local_1f8.m_size._3_1_ = 'p';
    local_1f8.m_size._4_1_ = 'r';
    local_1f8.m_size._5_1_ = 'e';
    local_1f8.m_size._6_1_ = 'v';
    local_1f8.m_size._7_1_ = '_';
    local_1f8.m_free_head._0_4_ = 0x6c626973;
    local_1f8.m_buf = (NodeData *)0x6166206b63656863;
    local_1f8.m_cap._0_1_ = 'i';
    local_1f8.m_cap._1_1_ = 'l';
    local_1f8.m_cap._2_1_ = 'e';
    local_1f8.m_cap._3_1_ = 'd';
    local_1f8.m_cap._4_1_ = ':';
    local_1f8.m_cap._5_1_ = ' ';
    local_1f8.m_cap._6_1_ = '(';
    local_1f8.m_cap._7_1_ = 'b';
    local_1f8.m_free_head._4_4_ = 0x20676e69;
    local_1f8.m_free_tail._0_7_ = 0x296269203d21;
    if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_1f8.m_arena_pos = 0;
    local_1f8.m_callbacks.m_user_data = (void *)0x64e9;
    local_1f8.m_callbacks.m_allocate = (pfn_allocate)0x0;
    local_1f8.m_callbacks.m_free = (pfn_free)0x24bb3d;
    local_1f8.m_callbacks.m_error = (pfn_error)0x65;
    this_00 = (char *)&local_1f8;
    sVar17 = 0x27;
    auVar4 = ZEXT1224(ZEXT412(0x64e9) << 0x40);
    LVar13.name.str._0_4_ = 0x24bb3d;
    LVar13.super_LineCol.offset = auVar4._0_8_;
    LVar13.super_LineCol.line = auVar4._8_8_;
    LVar13.super_LineCol.col = auVar4._16_8_;
    LVar13.name.str._4_4_ = 0;
    LVar13.name.len = 0x65;
    (*(this->m_callbacks).m_error)(this_00,0x27,LVar13,(this->m_callbacks).m_user_data);
  }
  sVar19 = pNVar1[ia].m_parent;
  sVar20 = *(size_t *)(sVar14 + 0x68);
  if (sVar19 == ib) {
    if (sVar20 == ia) {
      _swap_hierarchy();
      uVar16 = ((Tree *)this_00)->m_cap;
      if (extraout_RDX == 0xffffffffffffffff || uVar16 <= extraout_RDX) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        (*(code *)PTR_error_impl_0029d7a8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        uVar16 = ((Tree *)this_00)->m_cap;
      }
      pNVar1 = ((Tree *)this_00)->m_buf;
      pNVar21 = pNVar1;
      if (sVar17 == 0xffffffffffffffff || uVar16 <= sVar17) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        (*(code *)PTR_error_impl_0029d7a8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pNVar21 = ((Tree *)this_00)->m_buf;
        uVar16 = ((Tree *)this_00)->m_cap;
      }
      uVar18 = pNVar1[extraout_RDX].m_parent;
      if ((uVar18 == 0xffffffffffffffff) || (pNVar22 = pNVar21, uVar16 <= uVar18)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        (*(code *)PTR_error_impl_0029d7a8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pNVar22 = ((Tree *)this_00)->m_buf;
      }
      for (uVar16 = pNVar1[extraout_RDX].m_first_child; uVar16 != 0xffffffffffffffff;
          uVar16 = next_sibling((Tree *)this_00,uVar16)) {
        if (((Tree *)this_00)->m_cap <= uVar16) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          (*(code *)PTR_error_impl_0029d7a8)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        ((Tree *)this_00)->m_buf[uVar16].m_parent = sVar17;
      }
      uVar16 = pNVar1[extraout_RDX].m_prev_sibling;
      if (uVar16 != 0xffffffffffffffff) {
        if (((Tree *)this_00)->m_cap <= uVar16) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          (*(code *)PTR_error_impl_0029d7a8)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        ((Tree *)this_00)->m_buf[uVar16].m_next_sibling = sVar17;
      }
      uVar16 = pNVar1[extraout_RDX].m_next_sibling;
      if (uVar16 != 0xffffffffffffffff) {
        if (((Tree *)this_00)->m_cap <= uVar16) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          (*(code *)PTR_error_impl_0029d7a8)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        ((Tree *)this_00)->m_buf[uVar16].m_prev_sibling = sVar17;
      }
      if (pNVar22[uVar18].m_first_child == extraout_RDX) {
        pNVar22[uVar18].m_first_child = sVar17;
      }
      if (pNVar22[uVar18].m_last_child == extraout_RDX) {
        pNVar22[uVar18].m_last_child = sVar17;
      }
      sVar19 = pNVar1[extraout_RDX].m_first_child;
      pNVar21[sVar17].m_parent = pNVar1[extraout_RDX].m_parent;
      (&pNVar21[sVar17].m_parent)[1] = sVar19;
      pNVar21[sVar17].m_prev_sibling = pNVar1[extraout_RDX].m_prev_sibling;
      sVar19 = pNVar1[extraout_RDX].m_next_sibling;
      pNVar21[sVar17].m_last_child = pNVar1[extraout_RDX].m_last_child;
      (&pNVar21[sVar17].m_last_child)[1] = sVar19;
      return;
    }
    pNVar1[ia].m_parent = sVar20;
    *(size_t *)(sVar14 + 0x68) = ia;
  }
  else if (sVar20 == ia) {
    *(size_t *)(sVar14 + 0x68) = sVar19;
    pNVar1[ia].m_parent = ib;
  }
  else {
    pNVar1[ia].m_parent = sVar20;
    *(size_t *)(sVar14 + 0x68) = sVar19;
  }
  return;
}

Assistant:

void Tree::_swap_hierarchy(size_t ia, size_t ib)
{
    if(ia == ib) return;

    for(size_t i = first_child(ia); i != NONE; i = next_sibling(i))
    {
        if(i == ib || i == ia)
            continue;
        _p(i)->m_parent = ib;
    }

    for(size_t i = first_child(ib); i != NONE; i = next_sibling(i))
    {
        if(i == ib || i == ia)
            continue;
        _p(i)->m_parent = ia;
    }

    auto & C4_RESTRICT a  = *_p(ia);
    auto & C4_RESTRICT b  = *_p(ib);
    auto & C4_RESTRICT pa = *_p(a.m_parent);
    auto & C4_RESTRICT pb = *_p(b.m_parent);

    if(&pa == &pb)
    {
        if((pa.m_first_child == ib && pa.m_last_child == ia)
            ||
           (pa.m_first_child == ia && pa.m_last_child == ib))
        {
            std::swap(pa.m_first_child, pa.m_last_child);
        }
        else
        {
            bool changed = false;
            if(pa.m_first_child == ia)
            {
                pa.m_first_child = ib;
                changed = true;
            }
            if(pa.m_last_child  == ia)
            {
                pa.m_last_child = ib;
                changed = true;
            }
            if(pb.m_first_child == ib && !changed)
            {
                pb.m_first_child = ia;
            }
            if(pb.m_last_child  == ib && !changed)
            {
                pb.m_last_child  = ia;
            }
        }
    }
    else
    {
        if(pa.m_first_child == ia)
            pa.m_first_child = ib;
        if(pa.m_last_child  == ia)
            pa.m_last_child  = ib;
        if(pb.m_first_child == ib)
            pb.m_first_child = ia;
        if(pb.m_last_child  == ib)
            pb.m_last_child  = ia;
    }
    std::swap(a.m_first_child , b.m_first_child);
    std::swap(a.m_last_child  , b.m_last_child);

    if(a.m_prev_sibling != ib && b.m_prev_sibling != ia &&
       a.m_next_sibling != ib && b.m_next_sibling != ia)
    {
        if(a.m_prev_sibling != NONE && a.m_prev_sibling != ib)
            _p(a.m_prev_sibling)->m_next_sibling = ib;
        if(a.m_next_sibling != NONE && a.m_next_sibling != ib)
            _p(a.m_next_sibling)->m_prev_sibling = ib;
        if(b.m_prev_sibling != NONE && b.m_prev_sibling != ia)
            _p(b.m_prev_sibling)->m_next_sibling = ia;
        if(b.m_next_sibling != NONE && b.m_next_sibling != ia)
            _p(b.m_next_sibling)->m_prev_sibling = ia;
        std::swap(a.m_prev_sibling, b.m_prev_sibling);
        std::swap(a.m_next_sibling, b.m_next_sibling);
    }
    else
    {
        if(a.m_next_sibling == ib) // n will go after m
        {
            _RYML_CB_ASSERT(m_callbacks, b.m_prev_sibling == ia);
            if(a.m_prev_sibling != NONE)
            {
                _RYML_CB_ASSERT(m_callbacks, a.m_prev_sibling != ib);
                _p(a.m_prev_sibling)->m_next_sibling = ib;
            }
            if(b.m_next_sibling != NONE)
            {
                _RYML_CB_ASSERT(m_callbacks, b.m_next_sibling != ia);
                _p(b.m_next_sibling)->m_prev_sibling = ia;
            }
            size_t ns = b.m_next_sibling;
            b.m_prev_sibling = a.m_prev_sibling;
            b.m_next_sibling = ia;
            a.m_prev_sibling = ib;
            a.m_next_sibling = ns;
        }
        else if(a.m_prev_sibling == ib) // m will go after n
        {
            _RYML_CB_ASSERT(m_callbacks, b.m_next_sibling == ia);
            if(b.m_prev_sibling != NONE)
            {
                _RYML_CB_ASSERT(m_callbacks, b.m_prev_sibling != ia);
                _p(b.m_prev_sibling)->m_next_sibling = ia;
            }
            if(a.m_next_sibling != NONE)
            {
                _RYML_CB_ASSERT(m_callbacks, a.m_next_sibling != ib);
                _p(a.m_next_sibling)->m_prev_sibling = ib;
            }
            size_t ns = b.m_prev_sibling;
            a.m_prev_sibling = b.m_prev_sibling;
            a.m_next_sibling = ib;
            b.m_prev_sibling = ia;
            b.m_next_sibling = ns;
        }
        else
        {
            C4_NEVER_REACH();
        }
    }
    _RYML_CB_ASSERT(m_callbacks, a.m_next_sibling != ia);
    _RYML_CB_ASSERT(m_callbacks, a.m_prev_sibling != ia);
    _RYML_CB_ASSERT(m_callbacks, b.m_next_sibling != ib);
    _RYML_CB_ASSERT(m_callbacks, b.m_prev_sibling != ib);

    if(a.m_parent != ib && b.m_parent != ia)
    {
        std::swap(a.m_parent, b.m_parent);
    }
    else
    {
        if(a.m_parent == ib && b.m_parent != ia)
        {
            a.m_parent = b.m_parent;
            b.m_parent = ia;
        }
        else if(a.m_parent != ib && b.m_parent == ia)
        {
            b.m_parent = a.m_parent;
            a.m_parent = ib;
        }
        else
        {
            C4_NEVER_REACH();
        }
    }
}